

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O2

Abc_Obj_t * Abc_NtkMulti_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld)

{
  byte *pbVar1;
  DdManager *dd;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *vCone;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pFanin;
  DdNode *pDVar6;
  long lVar7;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb5,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pAVar5 = (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  if (pAVar5 == (Abc_Obj_t *)0x0) {
    if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xb9,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    pAVar5 = pNodeOld;
    iVar3 = Abc_AigNodeIsConst(pNodeOld);
    if (iVar3 != 0) {
      __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xba,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if ((pNodeOld->field_0x14 & 0x10) == 0) {
      __assert_fail("pNodeOld->fMarkA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xbb,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    vCone = Vec_PtrAlloc((int)pAVar5);
    if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x282,"void Abc_NtkMultiCone(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    vCone->nSize = 0;
    Abc_NtkMultiCone_rec
              ((Abc_Obj_t *)pNodeOld->pNtk->vObjs->pArray[*(pNodeOld->vFanins).pArray],vCone);
    Abc_NtkMultiCone_rec
              ((Abc_Obj_t *)pNodeOld->pNtk->vObjs->pArray[(pNodeOld->vFanins).pArray[1]],vCone);
    pAVar5 = Abc_NtkCreateNode(pNtkNew);
    iVar3 = vCone->nSize;
    for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      pFanin = Abc_NtkMulti_rec(pNtkNew,(Abc_Obj_t *)vCone->pArray[lVar7]);
      Abc_ObjAddFanin(pAVar5,pFanin);
    }
    dd = (DdManager *)pNtkNew->pManFunc;
    iVar4 = Abc_AigNodeIsConst(pNodeOld);
    if (iVar4 != 0) {
      __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xe3,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xe4,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
    for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      pvVar2 = vCone->pArray[lVar7];
      pDVar6 = Cudd_bddIthVar(dd,(int)lVar7);
      *(DdNode **)((long)pvVar2 + 0x38) = pDVar6;
      Cudd_Ref(pDVar6);
      pbVar1 = (byte *)((long)pvVar2 + 0x14);
      *pbVar1 = *pbVar1 | 0x40;
    }
    pDVar6 = Abc_NtkMultiDeriveBdd_rec(dd,pNodeOld,vCone);
    Cudd_Ref(pDVar6);
    for (lVar7 = 0; lVar7 < vCone->nSize; lVar7 = lVar7 + 1) {
      pvVar2 = vCone->pArray[lVar7];
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 0x38));
      pbVar1 = (byte *)((long)pvVar2 + 0x14);
      *pbVar1 = *pbVar1 & 0xbf;
    }
    Cudd_Deref(pDVar6);
    (pAVar5->field_5).pData = pDVar6;
    Cudd_Ref(pDVar6);
    Vec_PtrFree(vCone);
    (pNodeOld->field_6).pCopy = pAVar5;
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_NtkMulti_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld )
{
    Vec_Ptr_t * vCone;
    Abc_Obj_t * pNodeNew;
    int i;

    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( !Abc_AigNodeIsConst(pNodeOld) );
    assert( pNodeOld->fMarkA );

//printf( "%d ", Abc_NodeMffcSizeSupp(pNodeOld) );

    // collect the renoding cone
    vCone = Vec_PtrAlloc( 10 );
    Abc_NtkMultiCone( pNodeOld, vCone );

    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew ); 
    for ( i = 0; i < vCone->nSize; i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkMulti_rec(pNtkNew, (Abc_Obj_t *)vCone->pArray[i]) );

    // derive the function of this node
    pNodeNew->pData = Abc_NtkMultiDeriveBdd( (DdManager *)pNtkNew->pManFunc, pNodeOld, vCone );    
    Cudd_Ref( (DdNode *)pNodeNew->pData );
    Vec_PtrFree( vCone );

    // remember the node
    pNodeOld->pCopy = pNodeNew;
    return pNodeOld->pCopy;
}